

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_wiener_convolve_avx2.c
# Opt level: O2

void av1_highbd_wiener_convolve_add_src_avx2
               (uint8_t *src8,ptrdiff_t src_stride,uint8_t *dst8,ptrdiff_t dst_stride,
               int16_t *filter_x,int x_step_q4,int16_t *filter_y,int y_step_q4,int w,int h,
               WienerConvolveParams *conv_params,int bd)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  byte bVar6;
  char cVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  int j;
  long lVar12;
  undefined1 *puVar13;
  long lVar14;
  ushort uVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined4 uVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 local_8760 [1792];
  undefined1 local_8060 [32816];
  
  lVar14 = src_stride * -6 + (long)src8 * 2;
  uVar1 = conv_params->round_0;
  bVar6 = (byte)bd;
  auVar16._0_2_ = ~(ushort)(-1 << ((bVar6 - (char)uVar1) + 8 & 0x1f));
  iVar10 = (1 << (bVar6 + 6 & 0x1f)) + (1 << ((char)uVar1 - 1U & 0x1f));
  lVar9 = (long)dst8 * 2;
  auVar16._2_2_ = auVar16._0_2_;
  auVar16._4_2_ = auVar16._0_2_;
  auVar16._6_2_ = auVar16._0_2_;
  auVar16._8_2_ = auVar16._0_2_;
  auVar16._10_2_ = auVar16._0_2_;
  auVar16._12_2_ = auVar16._0_2_;
  auVar16._14_2_ = auVar16._0_2_;
  auVar16._16_2_ = auVar16._0_2_;
  auVar16._18_2_ = auVar16._0_2_;
  auVar16._20_2_ = auVar16._0_2_;
  auVar16._22_2_ = auVar16._0_2_;
  auVar16._24_2_ = auVar16._0_2_;
  auVar16._26_2_ = auVar16._0_2_;
  auVar16._28_2_ = auVar16._0_2_;
  auVar16._30_2_ = auVar16._0_2_;
  auVar2 = vpaddw_avx(*(undefined1 (*) [16])filter_x,_DAT_004c09d0);
  uVar23 = auVar2._0_4_;
  auVar17._4_4_ = uVar23;
  auVar17._0_4_ = uVar23;
  auVar17._8_4_ = uVar23;
  auVar17._12_4_ = uVar23;
  auVar17._16_4_ = uVar23;
  auVar17._20_4_ = uVar23;
  auVar17._24_4_ = uVar23;
  auVar17._28_4_ = uVar23;
  auVar3 = vpshufd_avx(auVar2,0x55);
  auVar19._0_8_ = auVar3._0_8_;
  auVar19._8_8_ = auVar19._0_8_;
  auVar19._16_8_ = auVar19._0_8_;
  auVar19._24_8_ = auVar19._0_8_;
  auVar3 = vpshufd_avx(auVar2,0xfa);
  auVar21._0_8_ = auVar3._0_8_;
  auVar21._8_8_ = auVar21._0_8_;
  auVar21._16_8_ = auVar21._0_8_;
  auVar21._24_8_ = auVar21._0_8_;
  auVar2 = vpshufd_avx(auVar2,0xff);
  auVar24._0_8_ = auVar2._0_8_;
  auVar24._8_8_ = auVar24._0_8_;
  auVar24._16_8_ = auVar24._0_8_;
  auVar24._24_8_ = auVar24._0_8_;
  uVar11 = 0;
  uVar8 = (ulong)(h + 7U);
  if ((int)(h + 7U) < 1) {
    uVar8 = uVar11;
  }
  auVar27._4_4_ = iVar10;
  auVar27._0_4_ = iVar10;
  auVar27._8_4_ = iVar10;
  auVar27._12_4_ = iVar10;
  auVar27._16_4_ = iVar10;
  auVar27._20_4_ = iVar10;
  auVar27._24_4_ = iVar10;
  auVar27._28_4_ = iVar10;
  puVar13 = local_8760;
  for (; uVar11 != uVar8; uVar11 = uVar11 + 1) {
    for (lVar12 = 0; lVar12 < w; lVar12 = lVar12 + 0x10) {
      auVar22 = vpmaddwd_avx2(auVar17,*(undefined1 (*) [32])(lVar14 + -6 + lVar12 * 2));
      auVar25 = vpmaddwd_avx2(auVar17,*(undefined1 (*) [32])(lVar14 + -4 + lVar12 * 2));
      auVar18 = vpmaddwd_avx2(auVar19,*(undefined1 (*) [32])(lVar14 + -2 + lVar12 * 2));
      auVar20 = vpmaddwd_avx2(auVar19,*(undefined1 (*) [32])(lVar14 + lVar12 * 2));
      auVar26 = vpmaddwd_avx2(auVar21,*(undefined1 (*) [32])(lVar14 + 2 + lVar12 * 2));
      auVar18 = vpaddd_avx2(auVar18,auVar26);
      auVar26 = vpmaddwd_avx2(auVar21,*(undefined1 (*) [32])(lVar14 + 4 + lVar12 * 2));
      auVar4 = vpmaddwd_avx2(auVar24,*(undefined1 (*) [32])(lVar14 + 6 + lVar12 * 2));
      auVar5 = vpmaddwd_avx2(auVar24,*(undefined1 (*) [32])(lVar14 + 8 + lVar12 * 2));
      auVar20 = vpaddd_avx2(auVar20,auVar26);
      auVar22 = vpaddd_avx2(auVar22,auVar27);
      auVar18 = vpaddd_avx2(auVar22,auVar18);
      auVar18 = vpaddd_avx2(auVar18,auVar4);
      auVar22 = vpsrad_avx2(auVar18,ZEXT416(uVar1));
      auVar18 = vpaddd_avx2(auVar25,auVar27);
      auVar18 = vpaddd_avx2(auVar18,auVar20);
      auVar18 = vpaddd_avx2(auVar18,auVar5);
      auVar18 = vpsrad_avx2(auVar18,ZEXT416(uVar1));
      auVar18 = vpackssdw_avx2(auVar22,auVar18);
      auVar18 = vpmaxsw_avx2(auVar18,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
      auVar18 = vpminsw_avx2(auVar18,auVar16);
      *(undefined1 (*) [32])(puVar13 + lVar12 * 2) = auVar18;
    }
    puVar13 = puVar13 + 0x100;
    lVar14 = lVar14 + src_stride * 2;
  }
  uVar15 = ~(ushort)(-1 << (bVar6 & 0x1f));
  auVar2 = vpaddw_avx(*(undefined1 (*) [16])filter_y,_DAT_004c09d0);
  uVar23 = auVar2._0_4_;
  auVar18._4_4_ = uVar23;
  auVar18._0_4_ = uVar23;
  auVar18._8_4_ = uVar23;
  auVar18._12_4_ = uVar23;
  auVar18._16_4_ = uVar23;
  auVar18._20_4_ = uVar23;
  auVar18._24_4_ = uVar23;
  auVar18._28_4_ = uVar23;
  auVar3 = vpshufd_avx(auVar2,0x55);
  auVar20._0_8_ = auVar3._0_8_;
  auVar20._8_8_ = auVar20._0_8_;
  auVar20._16_8_ = auVar20._0_8_;
  auVar20._24_8_ = auVar20._0_8_;
  auVar3 = vpshufd_avx(auVar2,0xfa);
  auVar22._0_8_ = auVar3._0_8_;
  auVar22._8_8_ = auVar22._0_8_;
  auVar22._16_8_ = auVar22._0_8_;
  auVar22._24_8_ = auVar22._0_8_;
  cVar7 = (char)conv_params->round_1;
  auVar2 = vpshufd_avx(auVar2,0xff);
  auVar25._0_8_ = auVar2._0_8_;
  auVar25._8_8_ = auVar25._0_8_;
  auVar25._16_8_ = auVar25._0_8_;
  auVar25._24_8_ = auVar25._0_8_;
  iVar10 = (-1 << ((cVar7 + bVar6) - 1 & 0x1f)) + (1 << (cVar7 - 1U & 0x1f));
  uVar8 = 0;
  if (h < 1) {
    h = 0;
  }
  auVar26._4_4_ = iVar10;
  auVar26._0_4_ = iVar10;
  auVar26._8_4_ = iVar10;
  auVar26._12_4_ = iVar10;
  auVar26._16_4_ = iVar10;
  auVar26._20_4_ = iVar10;
  auVar26._24_4_ = iVar10;
  auVar26._28_4_ = iVar10;
  puVar13 = local_8060;
  for (; uVar8 != (uint)h; uVar8 = uVar8 + 1) {
    for (lVar14 = 0; lVar14 < w; lVar14 = lVar14 + 0x10) {
      auVar16 = vpunpcklwd_avx2(*(undefined1 (*) [32])(puVar13 + lVar14 * 2 + -0x700),
                                *(undefined1 (*) [32])(puVar13 + lVar14 * 2 + -0x600));
      auVar17 = vpunpcklwd_avx2(*(undefined1 (*) [32])(puVar13 + lVar14 * 2 + -0x500),
                                *(undefined1 (*) [32])(puVar13 + lVar14 * 2 + -0x400));
      auVar19 = vpunpcklwd_avx2(*(undefined1 (*) [32])(puVar13 + lVar14 * 2 + -0x300),
                                *(undefined1 (*) [32])(puVar13 + lVar14 * 2 + -0x200));
      auVar16 = vpmaddwd_avx2(auVar16,auVar18);
      auVar17 = vpmaddwd_avx2(auVar17,auVar20);
      auVar16 = vpaddd_avx2(auVar16,auVar17);
      auVar21 = vpunpcklwd_avx2(*(undefined1 (*) [32])(puVar13 + lVar14 * 2 + -0x100),
                                *(undefined1 (*) [32])(puVar13 + lVar14 * 2));
      auVar17 = vpmaddwd_avx2(auVar19,auVar22);
      auVar19 = vpmaddwd_avx2(auVar21,auVar25);
      auVar17 = vpaddd_avx2(auVar19,auVar17);
      auVar16 = vpaddd_avx2(auVar16,auVar17);
      auVar17 = vpunpckhwd_avx2(*(undefined1 (*) [32])(puVar13 + lVar14 * 2 + -0x700),
                                *(undefined1 (*) [32])(puVar13 + lVar14 * 2 + -0x600));
      auVar19 = vpunpckhwd_avx2(*(undefined1 (*) [32])(puVar13 + lVar14 * 2 + -0x500),
                                *(undefined1 (*) [32])(puVar13 + lVar14 * 2 + -0x400));
      auVar21 = vpunpckhwd_avx2(*(undefined1 (*) [32])(puVar13 + lVar14 * 2 + -0x300),
                                *(undefined1 (*) [32])(puVar13 + lVar14 * 2 + -0x200));
      auVar24 = vpunpckhwd_avx2(*(undefined1 (*) [32])(puVar13 + lVar14 * 2 + -0x100),
                                *(undefined1 (*) [32])(puVar13 + lVar14 * 2));
      auVar17 = vpmaddwd_avx2(auVar17,auVar18);
      auVar19 = vpmaddwd_avx2(auVar19,auVar20);
      auVar17 = vpaddd_avx2(auVar19,auVar17);
      auVar19 = vpmaddwd_avx2(auVar21,auVar22);
      auVar21 = vpmaddwd_avx2(auVar24,auVar25);
      auVar19 = vpaddd_avx2(auVar21,auVar19);
      auVar17 = vpaddd_avx2(auVar17,auVar19);
      auVar21 = vpunpckldq_avx2(auVar16,auVar17);
      auVar19 = vpunpckhdq_avx2(auVar16,auVar17);
      auVar16 = vpaddd_avx2(auVar21,auVar26);
      auVar17 = vpsrad_avx2(auVar16,ZEXT416((uint)conv_params->round_1));
      auVar16 = vpaddd_avx2(auVar19,auVar26);
      auVar16 = vpsrad_avx2(auVar16,ZEXT416((uint)conv_params->round_1));
      auVar16 = vpackssdw_avx2(auVar17,auVar16);
      auVar16 = vpmaxsw_avx2(auVar16,_DAT_00470720);
      auVar4._2_2_ = uVar15;
      auVar4._0_2_ = uVar15;
      auVar4._4_2_ = uVar15;
      auVar4._6_2_ = uVar15;
      auVar4._8_2_ = uVar15;
      auVar4._10_2_ = uVar15;
      auVar4._12_2_ = uVar15;
      auVar4._14_2_ = uVar15;
      auVar4._16_2_ = uVar15;
      auVar4._18_2_ = uVar15;
      auVar4._20_2_ = uVar15;
      auVar4._22_2_ = uVar15;
      auVar4._24_2_ = uVar15;
      auVar4._26_2_ = uVar15;
      auVar4._28_2_ = uVar15;
      auVar4._30_2_ = uVar15;
      auVar16 = vpminsw_avx2(auVar16,auVar4);
      *(undefined1 (*) [32])(lVar9 + lVar14 * 2) = auVar16;
    }
    lVar9 = lVar9 + dst_stride * 2;
    puVar13 = puVar13 + 0x100;
  }
  return;
}

Assistant:

void av1_highbd_wiener_convolve_add_src_avx2(
    const uint8_t *src8, ptrdiff_t src_stride, uint8_t *dst8,
    ptrdiff_t dst_stride, const int16_t *filter_x, int x_step_q4,
    const int16_t *filter_y, int y_step_q4, int w, int h,
    const WienerConvolveParams *conv_params, int bd) {
  assert(x_step_q4 == 16 && y_step_q4 == 16);
  assert(!(w & 7));
  assert(bd + FILTER_BITS - conv_params->round_0 + 2 <= 16);
  (void)x_step_q4;
  (void)y_step_q4;

  const uint16_t *const src = CONVERT_TO_SHORTPTR(src8);
  uint16_t *const dst = CONVERT_TO_SHORTPTR(dst8);

  DECLARE_ALIGNED(32, uint16_t,
                  temp[(MAX_SB_SIZE + SUBPEL_TAPS - 1) * MAX_SB_SIZE]);
  int intermediate_height = h + SUBPEL_TAPS - 1;
  const int center_tap = ((SUBPEL_TAPS - 1) / 2);
  const uint16_t *const src_ptr = src - center_tap * src_stride - center_tap;

  const __m128i zero_128 = _mm_setzero_si128();
  const __m256i zero_256 = _mm256_setzero_si256();

  // Add an offset to account for the "add_src" part of the convolve function.
  const __m128i offset = _mm_insert_epi16(zero_128, 1 << FILTER_BITS, 3);

  const __m256i clamp_low = zero_256;

  /* Horizontal filter */
  {
    const __m256i clamp_high_ep =
        _mm256_set1_epi16(WIENER_CLAMP_LIMIT(conv_params->round_0, bd) - 1);

    // coeffs [ f7 f6 f5 f4 f3 f2 f1 f0 ]
    const __m128i coeffs_x = _mm_add_epi16(xx_loadu_128(filter_x), offset);

    // coeffs [ f3 f2 f3 f2 f1 f0 f1 f0 ]
    const __m128i coeffs_0123 = _mm_unpacklo_epi32(coeffs_x, coeffs_x);
    // coeffs [ f7 f6 f7 f6 f5 f4 f5 f4 ]
    const __m128i coeffs_4567 = _mm_unpackhi_epi32(coeffs_x, coeffs_x);

    // coeffs [ f1 f0 f1 f0 f1 f0 f1 f0 ]
    const __m128i coeffs_01_128 = _mm_unpacklo_epi64(coeffs_0123, coeffs_0123);
    // coeffs [ f3 f2 f3 f2 f3 f2 f3 f2 ]
    const __m128i coeffs_23_128 = _mm_unpackhi_epi64(coeffs_0123, coeffs_0123);
    // coeffs [ f5 f4 f5 f4 f5 f4 f5 f4 ]
    const __m128i coeffs_45_128 = _mm_unpacklo_epi64(coeffs_4567, coeffs_4567);
    // coeffs [ f7 f6 f7 f6 f7 f6 f7 f6 ]
    const __m128i coeffs_67_128 = _mm_unpackhi_epi64(coeffs_4567, coeffs_4567);

    // coeffs [ f1 f0 f1 f0 f1 f0 f1 f0 ][ f1 f0 f1 f0 f1 f0 f1 f0 ]
    const __m256i coeffs_01 = yy_set_m128i(coeffs_01_128, coeffs_01_128);
    // coeffs [ f3 f2 f3 f2 f3 f2 f3 f2 ][ f3 f2 f3 f2 f3 f2 f3 f2 ]
    const __m256i coeffs_23 = yy_set_m128i(coeffs_23_128, coeffs_23_128);
    // coeffs [ f5 f4 f5 f4 f5 f4 f5 f4 ][ f5 f4 f5 f4 f5 f4 f5 f4 ]
    const __m256i coeffs_45 = yy_set_m128i(coeffs_45_128, coeffs_45_128);
    // coeffs [ f7 f6 f7 f6 f7 f6 f7 f6 ][ f7 f6 f7 f6 f7 f6 f7 f6 ]
    const __m256i coeffs_67 = yy_set_m128i(coeffs_67_128, coeffs_67_128);

    const __m256i round_const = _mm256_set1_epi32(
        (1 << (conv_params->round_0 - 1)) + (1 << (bd + FILTER_BITS - 1)));

    for (int i = 0; i < intermediate_height; ++i) {
      for (int j = 0; j < w; j += 16) {
        const uint16_t *src_ij = src_ptr + i * src_stride + j;

        // Load 16-bit src data
        const __m256i src_0 = yy_loadu_256(src_ij + 0);
        const __m256i src_1 = yy_loadu_256(src_ij + 1);
        const __m256i src_2 = yy_loadu_256(src_ij + 2);
        const __m256i src_3 = yy_loadu_256(src_ij + 3);
        const __m256i src_4 = yy_loadu_256(src_ij + 4);
        const __m256i src_5 = yy_loadu_256(src_ij + 5);
        const __m256i src_6 = yy_loadu_256(src_ij + 6);
        const __m256i src_7 = yy_loadu_256(src_ij + 7);

        // Multiply src data by filter coeffs and sum pairs
        const __m256i res_0 = _mm256_madd_epi16(src_0, coeffs_01);
        const __m256i res_1 = _mm256_madd_epi16(src_1, coeffs_01);
        const __m256i res_2 = _mm256_madd_epi16(src_2, coeffs_23);
        const __m256i res_3 = _mm256_madd_epi16(src_3, coeffs_23);
        const __m256i res_4 = _mm256_madd_epi16(src_4, coeffs_45);
        const __m256i res_5 = _mm256_madd_epi16(src_5, coeffs_45);
        const __m256i res_6 = _mm256_madd_epi16(src_6, coeffs_67);
        const __m256i res_7 = _mm256_madd_epi16(src_7, coeffs_67);

        // Calculate scalar product for even- and odd-indices separately,
        // increasing to 32-bit precision
        const __m256i res_even_sum = _mm256_add_epi32(
            _mm256_add_epi32(res_0, res_4), _mm256_add_epi32(res_2, res_6));
        const __m256i res_even = _mm256_srai_epi32(
            _mm256_add_epi32(res_even_sum, round_const), conv_params->round_0);

        const __m256i res_odd_sum = _mm256_add_epi32(
            _mm256_add_epi32(res_1, res_5), _mm256_add_epi32(res_3, res_7));
        const __m256i res_odd = _mm256_srai_epi32(
            _mm256_add_epi32(res_odd_sum, round_const), conv_params->round_0);

        // Reduce to 16-bit precision and pack even- and odd-index results
        // back into one register. The _mm256_packs_epi32 intrinsic returns
        // a register with the pixels ordered as follows:
        // [ 15 13 11 9 14 12 10 8 ] [ 7 5 3 1 6 4 2 0 ]
        const __m256i res = _mm256_packs_epi32(res_even, res_odd);
        const __m256i res_clamped =
            _mm256_min_epi16(_mm256_max_epi16(res, clamp_low), clamp_high_ep);

        // Store in a temporary array
        yy_storeu_256(temp + i * MAX_SB_SIZE + j, res_clamped);
      }
    }
  }

  /* Vertical filter */
  {
    const __m256i clamp_high = _mm256_set1_epi16((1 << bd) - 1);

    // coeffs [ f7 f6 f5 f4 f3 f2 f1 f0 ]
    const __m128i coeffs_y = _mm_add_epi16(xx_loadu_128(filter_y), offset);

    // coeffs [ f3 f2 f3 f2 f1 f0 f1 f0 ]
    const __m128i coeffs_0123 = _mm_unpacklo_epi32(coeffs_y, coeffs_y);
    // coeffs [ f7 f6 f7 f6 f5 f4 f5 f4 ]
    const __m128i coeffs_4567 = _mm_unpackhi_epi32(coeffs_y, coeffs_y);

    // coeffs [ f1 f0 f1 f0 f1 f0 f1 f0 ]
    const __m128i coeffs_01_128 = _mm_unpacklo_epi64(coeffs_0123, coeffs_0123);
    // coeffs [ f3 f2 f3 f2 f3 f2 f3 f2 ]
    const __m128i coeffs_23_128 = _mm_unpackhi_epi64(coeffs_0123, coeffs_0123);
    // coeffs [ f5 f4 f5 f4 f5 f4 f5 f4 ]
    const __m128i coeffs_45_128 = _mm_unpacklo_epi64(coeffs_4567, coeffs_4567);
    // coeffs [ f7 f6 f7 f6 f7 f6 f7 f6 ]
    const __m128i coeffs_67_128 = _mm_unpackhi_epi64(coeffs_4567, coeffs_4567);

    // coeffs [ f1 f0 f1 f0 f1 f0 f1 f0 ][ f1 f0 f1 f0 f1 f0 f1 f0 ]
    const __m256i coeffs_01 = yy_set_m128i(coeffs_01_128, coeffs_01_128);
    // coeffs [ f3 f2 f3 f2 f3 f2 f3 f2 ][ f3 f2 f3 f2 f3 f2 f3 f2 ]
    const __m256i coeffs_23 = yy_set_m128i(coeffs_23_128, coeffs_23_128);
    // coeffs [ f5 f4 f5 f4 f5 f4 f5 f4 ][ f5 f4 f5 f4 f5 f4 f5 f4 ]
    const __m256i coeffs_45 = yy_set_m128i(coeffs_45_128, coeffs_45_128);
    // coeffs [ f7 f6 f7 f6 f7 f6 f7 f6 ][ f7 f6 f7 f6 f7 f6 f7 f6 ]
    const __m256i coeffs_67 = yy_set_m128i(coeffs_67_128, coeffs_67_128);

    const __m256i round_const =
        _mm256_set1_epi32((1 << (conv_params->round_1 - 1)) -
                          (1 << (bd + conv_params->round_1 - 1)));

    for (int i = 0; i < h; ++i) {
      for (int j = 0; j < w; j += 16) {
        const uint16_t *temp_ij = temp + i * MAX_SB_SIZE + j;

        // Load 16-bit data from the output of the horizontal filter in
        // which the pixels are ordered as follows:
        // [ 15 13 11 9 14 12 10 8 ] [ 7 5 3 1 6 4 2 0 ]
        const __m256i data_0 = yy_loadu_256(temp_ij + 0 * MAX_SB_SIZE);
        const __m256i data_1 = yy_loadu_256(temp_ij + 1 * MAX_SB_SIZE);
        const __m256i data_2 = yy_loadu_256(temp_ij + 2 * MAX_SB_SIZE);
        const __m256i data_3 = yy_loadu_256(temp_ij + 3 * MAX_SB_SIZE);
        const __m256i data_4 = yy_loadu_256(temp_ij + 4 * MAX_SB_SIZE);
        const __m256i data_5 = yy_loadu_256(temp_ij + 5 * MAX_SB_SIZE);
        const __m256i data_6 = yy_loadu_256(temp_ij + 6 * MAX_SB_SIZE);
        const __m256i data_7 = yy_loadu_256(temp_ij + 7 * MAX_SB_SIZE);

        // Filter the even-indices, increasing to 32-bit precision
        const __m256i src_0 = _mm256_unpacklo_epi16(data_0, data_1);
        const __m256i src_2 = _mm256_unpacklo_epi16(data_2, data_3);
        const __m256i src_4 = _mm256_unpacklo_epi16(data_4, data_5);
        const __m256i src_6 = _mm256_unpacklo_epi16(data_6, data_7);

        const __m256i res_0 = _mm256_madd_epi16(src_0, coeffs_01);
        const __m256i res_2 = _mm256_madd_epi16(src_2, coeffs_23);
        const __m256i res_4 = _mm256_madd_epi16(src_4, coeffs_45);
        const __m256i res_6 = _mm256_madd_epi16(src_6, coeffs_67);

        const __m256i res_even = _mm256_add_epi32(
            _mm256_add_epi32(res_0, res_2), _mm256_add_epi32(res_4, res_6));

        // Filter the odd-indices, increasing to 32-bit precision
        const __m256i src_1 = _mm256_unpackhi_epi16(data_0, data_1);
        const __m256i src_3 = _mm256_unpackhi_epi16(data_2, data_3);
        const __m256i src_5 = _mm256_unpackhi_epi16(data_4, data_5);
        const __m256i src_7 = _mm256_unpackhi_epi16(data_6, data_7);

        const __m256i res_1 = _mm256_madd_epi16(src_1, coeffs_01);
        const __m256i res_3 = _mm256_madd_epi16(src_3, coeffs_23);
        const __m256i res_5 = _mm256_madd_epi16(src_5, coeffs_45);
        const __m256i res_7 = _mm256_madd_epi16(src_7, coeffs_67);

        const __m256i res_odd = _mm256_add_epi32(
            _mm256_add_epi32(res_1, res_3), _mm256_add_epi32(res_5, res_7));

        // Pixels are currently in the following order:
        // res_even order: [ 14 12 10 8 ] [ 6 4 2 0 ]
        // res_odd order:  [ 15 13 11 9 ] [ 7 5 3 1 ]
        //
        // Rearrange the pixels into the following order:
        // res_lo order: [ 11 10  9  8 ] [ 3 2 1 0 ]
        // res_hi order: [ 15 14 13 12 ] [ 7 6 5 4 ]
        const __m256i res_lo = _mm256_unpacklo_epi32(res_even, res_odd);
        const __m256i res_hi = _mm256_unpackhi_epi32(res_even, res_odd);

        const __m256i res_lo_round = _mm256_srai_epi32(
            _mm256_add_epi32(res_lo, round_const), conv_params->round_1);
        const __m256i res_hi_round = _mm256_srai_epi32(
            _mm256_add_epi32(res_hi, round_const), conv_params->round_1);

        // Reduce to 16-bit precision and pack into the correct order:
        // [ 15 14 13 12 11 10 9 8 ][ 7 6 5 4 3 2 1 0 ]
        const __m256i res_16bit =
            _mm256_packs_epi32(res_lo_round, res_hi_round);
        const __m256i res_16bit_clamped = _mm256_min_epi16(
            _mm256_max_epi16(res_16bit, clamp_low), clamp_high);

        // Store in the dst array
        yy_storeu_256(dst + i * dst_stride + j, res_16bit_clamped);
      }
    }
  }
}